

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_6a37::execute(anon_unknown_dwarf_6a37 *this,string_view command)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar4;
  string_view command_00;
  string_view command_01;
  string_view x;
  string_view x_00;
  string_view prefix;
  string_view prefix_00;
  string_view y;
  string_view y_00;
  string_view args;
  
  command_00._len = command._ptr;
  args._ptr = (char *)0x0;
  args._len = 0;
  command_00._ptr = (char *)this;
  prefix._len = 7;
  prefix._ptr = "log w1 ";
  bVar1 = prefixed(command_00,prefix,&args);
  uVar3 = extraout_XMM0_Da;
  uVar4 = extraout_XMM0_Db;
  if ((!bVar1) &&
     (command_01._len = (size_t)command_00._len, command_01._ptr = (char *)this, prefix_00._len = 7,
     prefix_00._ptr = "log w2 ", bVar1 = prefixed(command_01,prefix_00,&args),
     uVar3 = extraout_XMM0_Da_00, uVar4 = extraout_XMM0_Db_00, !bVar1)) {
    x._len = (size_t)command_00._len;
    x._ptr = (char *)this;
    y._len = 9;
    y._ptr = "terminate";
    bVar1 = mserialize::operator==(x,y);
    if (bVar1) {
      std::terminate();
    }
    x_00._len = (size_t)command_00._len;
    x_00._ptr = (char *)this;
    y_00._len = 4;
    y_00._ptr = "help";
    bVar1 = mserialize::operator==(x_00,y_00);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown command ");
      poVar2 = (ostream *)std::ostream::write((char *)poVar2,(long)this);
      std::operator<<(poVar2,"\n");
    }
    showHelp();
    return;
  }
  log((double)CONCAT44(uVar4,uVar3));
  return;
}

Assistant:

void execute(mserialize::string_view command)
{
    mserialize::string_view args;

    if      (prefixed(command, "log w1 ", args)) { log(w1, args); }
    else if (prefixed(command, "log w2 ", args)) { log(w2, args); }
    else if (command == "terminate")             { terminate(); }
    else if (command == "help")                  { showHelp(); }
    else { std::cerr << "Unknown command " << command << "\n"; showHelp(); }
}